

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TestSpec::TagPattern::TagPattern(TagPattern *this,string *tag,string *filterString)

{
  pointer pcVar1;
  
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR__Pattern_00181820;
  (this->super_Pattern).m_name._M_dataplus._M_p = (pointer)&(this->super_Pattern).m_name.field_2;
  pcVar1 = (filterString->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Pattern).m_name,pcVar1,pcVar1 + filterString->_M_string_length)
  ;
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR__TagPattern_00181870;
  toLower(&this->m_tag,tag);
  return;
}

Assistant:

TestSpec::TagPattern::TagPattern( std::string const& tag, std::string const& filterString )
    : Pattern( filterString )
    , m_tag( toLower( tag ) )
    {}